

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::InitGoogleTestImpl<wchar_t>(int *argc,wchar_t **argv)

{
  UnitTestImpl *in_RDI;
  int i;
  value_type *in_stack_ffffffffffffffa8;
  UnitTestImpl *in_stack_ffffffffffffffb0;
  String *rhs;
  String *in_stack_ffffffffffffffc0;
  int local_30;
  wchar_t **in_stack_ffffffffffffffd8;
  UnitTestImpl *local_8;
  
  g_init_gtest_count = g_init_gtest_count + 1;
  if ((g_init_gtest_count == 1) && (0 < *(int *)&in_RDI->_vptr_UnitTestImpl)) {
    rhs = (String *)&stack0xffffffffffffffe0;
    local_8 = in_RDI;
    StreamableToString<wchar_t*>(in_stack_ffffffffffffffd8);
    String::operator=(in_stack_ffffffffffffffc0,rhs);
    String::~String((String *)in_stack_ffffffffffffffb0);
    std::vector<testing::internal::String,_std::allocator<testing::internal::String>_>::clear
              ((vector<testing::internal::String,_std::allocator<testing::internal::String>_> *)
               0x2032a7);
    for (local_30 = 0; local_30 != *(int *)&local_8->_vptr_UnitTestImpl; local_30 = local_30 + 1) {
      in_stack_ffffffffffffffb0 = (UnitTestImpl *)&stack0xffffffffffffffc0;
      StreamableToString<wchar_t*>(in_stack_ffffffffffffffd8);
      std::vector<testing::internal::String,_std::allocator<testing::internal::String>_>::push_back
                ((vector<testing::internal::String,_std::allocator<testing::internal::String>_> *)
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      String::~String((String *)in_stack_ffffffffffffffb0);
    }
    ParseGoogleTestFlagsOnly((int *)in_stack_ffffffffffffffb0,(wchar_t **)in_stack_ffffffffffffffa8)
    ;
    GetUnitTestImpl();
    UnitTestImpl::PostFlagParsingInit(in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void InitGoogleTestImpl(int* argc, CharType** argv) {
  g_init_gtest_count++;

  // We don't want to run the initialization code twice.
  if (g_init_gtest_count != 1) return;

  if (*argc <= 0) return;

  internal::g_executable_path = internal::StreamableToString(argv[0]);

#if GTEST_HAS_DEATH_TEST

  g_argvs.clear();
  for (int i = 0; i != *argc; i++) {
    g_argvs.push_back(StreamableToString(argv[i]));
  }

#endif  // GTEST_HAS_DEATH_TEST

  ParseGoogleTestFlagsOnly(argc, argv);
  GetUnitTestImpl()->PostFlagParsingInit();
}